

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O3

ExchangeAbsolutePositionRequests __thiscall
adios2::aggregator::MPIChain::IExchangeAbsolutePosition(MPIChain *this,Buffer *buffer,int step)

{
  size_t *this_00;
  uint tag;
  char cVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  undefined8 in_RCX;
  size_type *psVar8;
  undefined4 in_register_00000014;
  unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_00;
  ulong uVar9;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_01;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_02;
  _Head_base<0UL,_adios2::helper::CommReqImpl_*,_false> _Var10;
  _Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_03;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_04;
  CommReqImpl *extraout_RDX_05;
  CommReqImpl *extraout_RDX_06;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ExchangeAbsolutePositionRequests EVar14;
  string __str;
  string local_b8;
  string local_98;
  string local_78;
  size_t *local_58;
  string local_50;
  
  lVar3 = CONCAT44(in_register_00000014,step);
  iVar2 = *(int *)((long)&buffer->m_FixedSize + 4);
  if (iVar2 == 1) {
    helper::Comm::Req::Req((Req *)this);
    helper::Comm::Req::Req((Req *)&(this->super_MPIAggregator).m_SubStreams);
    _Var10._M_head_impl =
         (CommReqImpl *)
         extraout_RDX._M_t.
         super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    goto LAB_006449dc;
  }
  if ((char)buffer[1].m_Type._M_string_length == '\x01') {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Toolkit","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"aggregator::mpi::MPIChain","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"IExchangeAbsolutePosition","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"An existing exchange is still active","");
    helper::Throw<std::runtime_error>(&local_78,&local_98,&local_b8,&local_50,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    iVar2 = *(int *)((long)&buffer->m_FixedSize + 4);
  }
  tag = (uint)in_RCX;
  uVar11 = 0;
  if (iVar2 - 1U != tag) {
    uVar11 = tag + 1;
  }
  helper::Comm::Req::Req((Req *)this);
  this_00 = &(this->super_MPIAggregator).m_SubStreams;
  helper::Comm::Req::Req((Req *)this_00);
  uVar12 = (uint)buffer->m_FixedSize;
  if (tag == 0) {
    buffer[1].m_Type.field_2._M_allocated_capacity =
         *(size_type *)(lVar3 + 0x30 + (ulong)(uVar12 == 0) * 8);
  }
  cVar1 = (char)((ulong)in_RCX >> 0x18) >> 7;
  local_58 = this_00;
  if (uVar12 == tag) {
    if (tag == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = *(long *)(lVar3 + 0x38);
    }
    *(size_type *)((long)&buffer[1].m_Type.field_2 + 8) =
         lVar3 + buffer[1].m_Type.field_2._M_allocated_capacity;
    uVar12 = -tag;
    if (0 < (int)tag) {
      uVar12 = tag;
    }
    uVar13 = 1;
    if (9 < uVar12) {
      uVar9 = (ulong)uVar12;
      uVar6 = 4;
      do {
        uVar13 = uVar6;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_00644871;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_00644871;
        }
        if (uVar7 < 10000) goto LAB_00644871;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar13 + 4;
      } while (99999 < uVar7);
      uVar13 = uVar13 + 1;
    }
LAB_00644871:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar13 - cVar1);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_b8._M_dataplus._M_p + (tag >> 0x1f),uVar13,uVar12);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x74f724);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = plVar4[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_98._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_78.field_2._M_allocated_capacity = *psVar8;
      local_78.field_2._8_8_ = plVar4[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar8;
      local_78._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_78._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    helper::Comm::Isend<unsigned_long>
              ((Comm *)&local_50,(unsigned_long *)((buffer->m_Type).field_2._M_local_buf + 8),
               (size_t)((long)&buffer[1].m_Type.field_2 + 8),1,uVar11,(string *)0x0);
    helper::Comm::Req::operator=((Req *)this,(Req *)&local_50);
    helper::Comm::Req::~Req((Req *)&local_50);
    _Var10._M_head_impl =
         (CommReqImpl *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
      _Var10._M_head_impl =
           (CommReqImpl *)
           extraout_RDX_02.
           super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_006449be:
      operator_delete(local_98._M_dataplus._M_p);
      _Var10._M_head_impl =
           (CommReqImpl *)
           extraout_RDX_03.super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    }
LAB_006449c3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
      _Var10._M_head_impl =
           (CommReqImpl *)
           extraout_RDX_04.
           super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    }
  }
  else {
    _Var10._M_head_impl =
         (CommReqImpl *)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    if (uVar12 == uVar11) {
      uVar11 = -tag;
      if (0 < (int)tag) {
        uVar11 = tag;
      }
      uVar12 = 1;
      if (9 < uVar11) {
        uVar9 = (ulong)uVar11;
        uVar13 = 4;
        do {
          uVar12 = uVar13;
          uVar6 = (uint)uVar9;
          if (uVar6 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_006449fa;
          }
          if (uVar6 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_006449fa;
          }
          if (uVar6 < 10000) goto LAB_006449fa;
          uVar9 = uVar9 / 10000;
          uVar13 = uVar12 + 4;
        } while (99999 < uVar6);
        uVar12 = uVar12 + 1;
      }
LAB_006449fa:
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar12 - cVar1);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_b8._M_dataplus._M_p + (tag >> 0x1f),uVar12,uVar11);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x74f758);
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = puVar5[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_98._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_78.field_2._M_allocated_capacity = *psVar8;
        local_78.field_2._8_8_ = puVar5[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar8;
        local_78._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_78._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      helper::Comm::Irecv<unsigned_long>
                ((Comm *)&local_50,(unsigned_long *)((buffer->m_Type).field_2._M_local_buf + 8),
                 lVar3 + 0x38,1,tag,(string *)0x0);
      helper::Comm::Req::operator=((Req *)local_58,(Req *)&local_50);
      helper::Comm::Req::~Req((Req *)&local_50);
      _Var10._M_head_impl = extraout_RDX_05;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
        _Var10._M_head_impl = extraout_RDX_06;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_006449be;
      goto LAB_006449c3;
    }
  }
  *(undefined1 *)&buffer[1].m_Type._M_string_length = 1;
LAB_006449dc:
  EVar14.m_Recv.m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       _Var10._M_head_impl;
  EVar14.m_Send.m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       this;
  return EVar14;
}

Assistant:

MPIChain::ExchangeAbsolutePositionRequests
MPIChain::IExchangeAbsolutePosition(format::Buffer &buffer, const int step)
{
    if (m_Size == 1)
    {
        return {};
    }

    if (m_IsInExchangeAbsolutePosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "aggregator::mpi::MPIChain",
                                          "IExchangeAbsolutePosition",
                                          "An existing exchange is still active");
    }

    const int destination = (step != m_Size - 1) ? step + 1 : 0;
    ExchangeAbsolutePositionRequests requests;

    if (step == 0)
    {
        m_SizeSend = (m_Rank == 0) ? buffer.m_AbsolutePosition : buffer.m_Position;
    }

    if (m_Rank == step)
    {
        m_ExchangeAbsolutePosition =
            (m_Rank == 0) ? m_SizeSend : m_SizeSend + buffer.m_AbsolutePosition;

        requests.m_Send = m_Comm.Isend(&m_ExchangeAbsolutePosition, 1, destination, 0,
                                       ", aggregation Isend absolute position at iteration " +
                                           std::to_string(step) + "\n");
    }
    else if (m_Rank == destination)
    {
        requests.m_Recv = m_Comm.Irecv(&buffer.m_AbsolutePosition, 1, step, 0,
                                       ", aggregation Irecv absolute position at iteration " +
                                           std::to_string(step) + "\n");
    }

    m_IsInExchangeAbsolutePosition = true;
    return requests;
}